

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_modern_uniform(CompilerHLSL *this,SPIRVariable *var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  bool bVar4;
  SPIRType *type;
  const_iterator cVar5;
  undefined1 *puVar6;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  string local_50;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  BVar3 = type->basetype;
  if (BVar3 - Image < 2) {
    local_58 = "";
    if ((BVar3 == Image) && ((type->image).sampled == 2)) {
      bVar4 = Compiler::has_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Coherent);
      local_58 = "";
      if (bVar4) {
        local_58 = "globallycoherent ";
      }
    }
    image_type_hlsl_modern_abi_cxx11_(&local_b8,this,type,(var->super_IVariant).self.id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_98,this,(ulong)(var->super_IVariant).self.id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (&local_78,this,type,(ulong)(var->super_IVariant).self.id);
    to_resource_binding_abi_cxx11_(&local_50,this,var);
    CompilerGLSL::
    statement<char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_58,&local_b8,(char (*) [2])0x36a6d9,&local_98,
               &local_78,&local_50,(char (*) [2])0x397f80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    paVar1 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    paVar2 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,(uint32_t)local_b8._M_dataplus._M_p) !=
        &local_b8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_b8._M_dataplus._M_p._4_4_,(uint32_t)local_b8._M_dataplus._M_p))
      ;
    }
    if (type->basetype != SampledImage) {
      return;
    }
    if ((type->image).dim == Buffer) {
      return;
    }
    bVar4 = Compiler::is_depth_image((Compiler *)this,type,(var->super_IVariant).self.id);
    if (bVar4) {
      to_sampler_expression_abi_cxx11_(&local_b8,this,(var->super_IVariant).self.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_98,this,type,(ulong)(var->super_IVariant).self.id);
      to_resource_binding_sampler_abi_cxx11_(&local_78,this,var);
      CompilerGLSL::
      statement<char_const(&)[24],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [24])"SamplerComparisonState ",&local_b8,
                 &local_98,&local_78,(char (*) [2])0x397f80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      puVar6 = (undefined1 *)
               CONCAT44(local_b8._M_dataplus._M_p._4_4_,(uint32_t)local_b8._M_dataplus._M_p);
    }
    else {
      to_sampler_expression_abi_cxx11_(&local_b8,this,(var->super_IVariant).self.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_98,this,type,(ulong)(var->super_IVariant).self.id);
      to_resource_binding_sampler_abi_cxx11_(&local_78,this,var);
      CompilerGLSL::
      statement<char_const(&)[14],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [14])"SamplerState ",&local_b8,&local_98,
                 &local_78,(char (*) [2])0x397f80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      puVar6 = (undefined1 *)
               CONCAT44(local_b8._M_dataplus._M_p._4_4_,(uint32_t)local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6 == &local_b8.field_2) {
      return;
    }
  }
  else if (BVar3 == Sampler) {
    local_b8._M_dataplus._M_p._0_4_ = (var->super_IVariant).self.id;
    cVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->super_CompilerGLSL).super_Compiler.comparison_ids._M_h,
                   (key_type *)&local_b8);
    if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_b8,this,(ulong)(var->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_98,this,type,(ulong)(var->super_IVariant).self.id);
      to_resource_binding_abi_cxx11_(&local_78,this,var);
      CompilerGLSL::
      statement<char_const(&)[14],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [14])"SamplerState ",&local_b8,&local_98,
                 &local_78,(char (*) [2])0x397f80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      puVar6 = (undefined1 *)
               CONCAT44(local_b8._M_dataplus._M_p._4_4_,(uint32_t)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6 == &local_b8.field_2) {
        return;
      }
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_b8,this,(ulong)(var->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_98,this,type,(ulong)(var->super_IVariant).self.id);
      to_resource_binding_abi_cxx11_(&local_78,this,var);
      CompilerGLSL::
      statement<char_const(&)[24],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [24])"SamplerComparisonState ",&local_b8,
                 &local_98,&local_78,(char (*) [2])0x397f80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      puVar6 = (undefined1 *)
               CONCAT44(local_b8._M_dataplus._M_p._4_4_,(uint32_t)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6 == &local_b8.field_2) {
        return;
      }
    }
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x28])(&local_b8,this,var);
    to_resource_binding_abi_cxx11_(&local_98,this,var);
    CompilerGLSL::statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_b8,&local_98,(char (*) [2])0x397f80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    puVar6 = (undefined1 *)
             CONCAT44(local_b8._M_dataplus._M_p._4_4_,(uint32_t)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6 == &local_b8.field_2) {
      return;
    }
  }
  operator_delete(puVar6);
  return;
}

Assistant:

void CompilerHLSL::emit_modern_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	switch (type.basetype)
	{
	case SPIRType::SampledImage:
	case SPIRType::Image:
	{
		bool is_coherent = false;
		if (type.basetype == SPIRType::Image && type.image.sampled == 2)
			is_coherent = has_decoration(var.self, DecorationCoherent);

		statement(is_coherent ? "globallycoherent " : "", image_type_hlsl_modern(type, var.self), " ",
		          to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var), ";");

		if (type.basetype == SPIRType::SampledImage && type.image.dim != DimBuffer)
		{
			// For combined image samplers, also emit a combined image sampler.
			if (is_depth_image(type, var.self))
				statement("SamplerComparisonState ", to_sampler_expression(var.self), type_to_array_glsl(type, var.self),
				          to_resource_binding_sampler(var), ";");
			else
				statement("SamplerState ", to_sampler_expression(var.self), type_to_array_glsl(type, var.self),
				          to_resource_binding_sampler(var), ";");
		}
		break;
	}

	case SPIRType::Sampler:
		if (comparison_ids.count(var.self))
			statement("SamplerComparisonState ", to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var),
			          ";");
		else
			statement("SamplerState ", to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var), ";");
		break;

	default:
		statement(variable_decl(var), to_resource_binding(var), ";");
		break;
	}
}